

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O0

int __thiscall
JsUtil::
BaseHashSet<Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::CharacterBuffer<char16_t>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
::AddNew(BaseHashSet<Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::CharacterBuffer<char16_t>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
         *this,Symbol **element)

{
  int iVar1;
  CharacterBuffer<char16_t> local_28;
  Symbol **local_18;
  Symbol **element_local;
  BaseHashSet<Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_JsUtil::CharacterBuffer<char16_t>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
  *this_local;
  
  local_18 = element;
  element_local = (Symbol **)this;
  ValueToKey<JsUtil::CharacterBuffer<char16_t>,_Symbol_*>::ToKey
            ((ValueToKey<JsUtil::CharacterBuffer<char16_t>,_Symbol_*> *)&local_28,element);
  iVar1 = BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
          ::AddNew(&this->
                    super_BaseDictionary<JsUtil::CharacterBuffer<char16_t>,_Symbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::HashedEntry,_JsUtil::NoResizeLock>
                   ,&local_28,local_18);
  return iVar1;
}

Assistant:

int AddNew(TElement const& element)
        {
            return __super::AddNew(ValueToKey<TKey, TElement>::ToKey(element), element);
        }